

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

string * __thiscall
wabt::cat<char[3],char_const*,char[2],wabt::string_view>
          (string *__return_storage_ptr__,wabt *this,char (*args) [3],char **args_1,
          char (*args_2) [2],string_view *args_3)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<char[3],char_const*,char[2],wabt::string_view>
            ((char (*) [3])this,(char **)args,(char (*) [2])args_1,(string_view *)args_2);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[3],char_const*,char[2],wabt::string_view>
            (__return_storage_ptr__,(char (*) [3])this,(char **)args,(char (*) [2])args_1,
             (string_view *)args_2);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}